

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerHLSL::to_interpolation_qualifiers_abi_cxx11_
          (string *__return_storage_ptr__,CompilerHLSL *this,Bitset *flags)

{
  bool bVar1;
  Bitset *flags_local;
  CompilerHLSL *this_local;
  string *res;
  
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  bVar1 = Bitset::get(flags,0xe);
  if ((bVar1) || (bVar1 = Bitset::get(flags,0x14a5), bVar1)) {
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"nointerpolation ");
  }
  bVar1 = Bitset::get(flags,0xd);
  if (bVar1) {
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"noperspective ");
  }
  bVar1 = Bitset::get(flags,0x10);
  if (bVar1) {
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"centroid ");
  }
  bVar1 = Bitset::get(flags,0xf);
  if (bVar1) {
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"patch ");
  }
  bVar1 = Bitset::get(flags,0x11);
  if (bVar1) {
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"sample ");
  }
  bVar1 = Bitset::get(flags,0x12);
  if ((bVar1) && (((this->super_CompilerGLSL).backend.support_precise_qualifier & 1U) != 0)) {
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"precise ");
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerHLSL::to_interpolation_qualifiers(const Bitset &flags)
{
	string res;
	//if (flags & (1ull << DecorationSmooth))
	//    res += "linear ";
	if (flags.get(DecorationFlat) || flags.get(DecorationPerVertexKHR))
		res += "nointerpolation ";
	if (flags.get(DecorationNoPerspective))
		res += "noperspective ";
	if (flags.get(DecorationCentroid))
		res += "centroid ";
	if (flags.get(DecorationPatch))
		res += "patch "; // Seems to be different in actual HLSL.
	if (flags.get(DecorationSample))
		res += "sample ";
	if (flags.get(DecorationInvariant) && backend.support_precise_qualifier)
		res += "precise "; // Not supported?

	return res;
}